

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

IPCFrame * __thiscall perfetto::protos::gen::IPCFrame::operator=(IPCFrame *this,IPCFrame *param_1)

{
  this->request_id_ = param_1->request_id_;
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindService>::operator=
            (&this->msg_bind_service_,&param_1->msg_bind_service_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindServiceReply>::operator=
            (&this->msg_bind_service_reply_,&param_1->msg_bind_service_reply_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod>::operator=
            (&this->msg_invoke_method_,&param_1->msg_invoke_method_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethodReply>::operator=
            (&this->msg_invoke_method_reply_,&param_1->msg_invoke_method_reply_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError>::operator=
            (&this->msg_request_error_,&param_1->msg_request_error_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->data_for_testing_,&param_1->data_for_testing_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool IPCFrame::operator==(const IPCFrame& other) const {
  return unknown_fields_ == other.unknown_fields_
   && request_id_ == other.request_id_
   && msg_bind_service_ == other.msg_bind_service_
   && msg_bind_service_reply_ == other.msg_bind_service_reply_
   && msg_invoke_method_ == other.msg_invoke_method_
   && msg_invoke_method_reply_ == other.msg_invoke_method_reply_
   && msg_request_error_ == other.msg_request_error_
   && data_for_testing_ == other.data_for_testing_;
}